

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O2

void re2::RE2CL8622304(void)

{
  bool bVar1;
  string key;
  string val;
  string dir;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  StringPiece local_1f8;
  undefined1 local_1e8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  LogMessageFatal local_198;
  
  local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
  local_1b8._M_string_length = 0;
  local_1b8.field_2._M_local_buf[0] = '\0';
  local_218._M_dataplus._M_p = "D";
  local_218._M_string_length = CONCAT44(local_218._M_string_length._4_4_,1);
  RE2::RE2((RE2 *)&local_198,"([^\\\\])");
  bVar1 = RE2::FullMatch<>((StringPiece *)&local_218,(RE2 *)&local_198);
  RE2::~RE2((RE2 *)&local_198);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_198,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x4e2);
    std::operator<<((ostream *)&local_198.super_LogMessage.str_,
                    "Check failed: RE2::FullMatch(\"D\", \"([^\\\\\\\\])\")");
    LogMessageFatal::~LogMessageFatal(&local_198);
  }
  local_218._M_dataplus._M_p = "D";
  local_218._M_string_length = CONCAT44(local_218._M_string_length._4_4_,1);
  RE2::RE2((RE2 *)&local_198,"([^\\\\])");
  local_1e8._0_8_ = &local_1b8;
  bVar1 = RE2::FullMatch<std::__cxx11::string*>
                    ((StringPiece *)&local_218,(RE2 *)&local_198,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)local_1e8
                    );
  RE2::~RE2((RE2 *)&local_198);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_198,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x4e3);
    std::operator<<((ostream *)&local_198.super_LogMessage.str_,
                    "Check failed: RE2::FullMatch(\"D\", \"([^\\\\\\\\])\", &dir)");
    LogMessageFatal::~LogMessageFatal(&local_198);
  }
  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  local_218._M_string_length = 0;
  local_218.field_2._M_local_buf[0] = '\0';
  local_1e8._0_8_ = local_1e8 + 0x10;
  local_1e8._8_8_ = 0;
  local_1e8[0x10] = '\0';
  local_1f8.ptr_ = "bar:1,0x2F,030,4,5;baz:true;fooby:false,true";
  local_1f8.length_ = 0x2c;
  RE2::RE2((RE2 *)&local_198,"(\\w+)(?::((?:[^;\\\\]|\\\\.)*))?;?");
  local_1c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8;
  local_1c0 = &local_218;
  bVar1 = RE2::PartialMatch<std::__cxx11::string*,std::__cxx11::string*>
                    (&local_1f8,(RE2 *)&local_198,&local_1c0,&local_1c8);
  RE2::~RE2((RE2 *)&local_198);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_198,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x4ea);
    std::operator<<((ostream *)&local_198.super_LogMessage.str_,
                    "Check failed: RE2::PartialMatch(\"bar:1,0x2F,030,4,5;baz:true;fooby:false,true\", \"(\\\\w+)(?::((?:[^;\\\\\\\\]|\\\\\\\\.)*))?;?\", &key, &val)"
                   );
    LogMessageFatal::~LogMessageFatal(&local_198);
  }
  bVar1 = std::operator==(&local_218,"bar");
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_198,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x4eb);
    std::operator<<((ostream *)&local_198.super_LogMessage.str_,"Check failed: (key) == (\"bar\")");
    LogMessageFatal::~LogMessageFatal(&local_198);
  }
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_1e8,"1,0x2F,030,4,5");
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_198,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x4ec);
    std::operator<<((ostream *)&local_198.super_LogMessage.str_,
                    "Check failed: (val) == (\"1,0x2F,030,4,5\")");
    LogMessageFatal::~LogMessageFatal(&local_198);
  }
  std::__cxx11::string::~string((string *)local_1e8);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_1b8);
  return;
}

Assistant:

TEST(CheckRewriteString, all) {
  TestCheckRewriteString("abc", "foo", true);
  TestCheckRewriteString("abc", "foo\\", false);
  TestCheckRewriteString("abc", "foo\\0bar", true);

  TestCheckRewriteString("a(b)c", "foo", true);
  TestCheckRewriteString("a(b)c", "foo\\0bar", true);
  TestCheckRewriteString("a(b)c", "foo\\1bar", true);
  TestCheckRewriteString("a(b)c", "foo\\2bar", false);
  TestCheckRewriteString("a(b)c", "f\\\\2o\\1o", true);

  TestCheckRewriteString("a(b)(c)", "foo\\12", true);
  TestCheckRewriteString("a(b)(c)", "f\\2o\\1o", true);
  TestCheckRewriteString("a(b)(c)", "f\\oo\\1", false);
}